

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

Range<float,_3> * __thiscall Nova::Grid<float,_3>::Cell_Domain(Grid<float,_3> *this,T_INDEX *index)

{
  int i;
  long lVar1;
  Range<float,_3> *in_RDI;
  TV corner;
  Vector<float,_3,_true> data_copy_2;
  Vector<float,_3,_true> data_copy;
  
  lVar1 = 0;
  do {
    data_copy._data._M_elems[lVar1] = (float)(index->_data)._M_elems[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) *
         *(float *)((long)(this->dX)._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  corner._data._M_elems[2] = (this->domain).min_corner._data._M_elems[2];
  corner._data._M_elems._0_8_ = *(undefined8 *)(this->domain).min_corner._data._M_elems;
  lVar1 = 0;
  do {
    *(float *)((long)corner._data._M_elems + lVar1) =
         *(float *)((long)corner._data._M_elems + lVar1) +
         *(float *)((long)data_copy._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  data_copy_2._data._M_elems[2] = corner._data._M_elems[2];
  data_copy_2._data._M_elems[0] = corner._data._M_elems[0];
  data_copy_2._data._M_elems[1] = corner._data._M_elems[1];
  lVar1 = 0;
  do {
    *(float *)((long)data_copy_2._data._M_elems + lVar1) =
         *(float *)((long)data_copy_2._data._M_elems + lVar1) -
         *(float *)((long)(this->dX)._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  (in_RDI->min_corner)._data._M_elems[2] = data_copy_2._data._M_elems[2];
  *(undefined8 *)(in_RDI->min_corner)._data._M_elems = data_copy_2._data._M_elems._0_8_;
  *(undefined8 *)(in_RDI->max_corner)._data._M_elems = corner._data._M_elems._0_8_;
  (in_RDI->max_corner)._data._M_elems[2] = corner._data._M_elems[2];
  return in_RDI;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }